

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contract.cpp
# Opt level: O0

void __thiscall
Contract::Contract(Contract *this,string *id,int *minAssignments,int *maxAssignments,
                  int *minWorkingDays,int *maxWorkingDays,int *minDaysOff,int *maxDaysOff,
                  int *WorkingWeekends,int *completeWeekends)

{
  int *maxWorkingDays_local;
  int *minWorkingDays_local;
  int *maxAssignments_local;
  int *minAssignments_local;
  string *id_local;
  Contract *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)id);
  this->minimumNumberOfAssignments = *minAssignments;
  this->maximumNumberOfAssignments = *maxAssignments;
  this->minimumNumberOfConsecutiveWorkingDays = *minWorkingDays;
  this->maximumNumberOfConsecutiveWorkingDays = *maxWorkingDays;
  this->minimumNumberOfConsecutiveDaysOff = *minDaysOff;
  this->maximumNumberOfConsecutiveDaysOff = *maxDaysOff;
  this->maximumNumberOfWorkingWeekends = *WorkingWeekends;
  this->completeWeekends = (bool)(-(*completeWeekends == 1) & 1);
  return;
}

Assistant:

Contract::Contract(const string &id, const int &minAssignments, const int &maxAssignments, const int &minWorkingDays,
                   const int &maxWorkingDays, const int &minDaysOff, const int &maxDaysOff, const int &WorkingWeekends,
                   const int &completeWeekends) {
    this->id = id;
    minimumNumberOfAssignments = minAssignments;
    maximumNumberOfAssignments = maxAssignments;
    minimumNumberOfConsecutiveWorkingDays = minWorkingDays;
    maximumNumberOfConsecutiveWorkingDays = maxWorkingDays;
    minimumNumberOfConsecutiveDaysOff = minDaysOff;
    maximumNumberOfConsecutiveDaysOff = maxDaysOff;
    maximumNumberOfWorkingWeekends = WorkingWeekends;
    this->completeWeekends = completeWeekends == 1 ? true : false;
}